

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::storeSamples(GibbsSamplerFromHDP *this)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  uint local_24;
  uint local_20;
  int t;
  int j;
  int v;
  int k_1;
  int k;
  GibbsSamplerFromHDP *this_local;
  
  this->_samplingCount = this->_samplingCount + 1;
  for (v = 0; (uint)v < this->_K; v = v + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_nk,(long)v);
    uVar1 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_sumOfNkSampled,(long)v);
    *pvVar3 = (double)uVar1 + *pvVar3;
  }
  for (j = 0; (uint)j < this->_K; j = j + 1) {
    for (t = 0; (uint)t < this->_V; t = t + 1) {
      pvVar4 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_nkv,(long)j);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar4,(long)t);
      uVar1 = *pvVar2;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_sumOfNkvSampled,(long)j);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)t);
      *pvVar3 = (double)uVar1 + *pvVar3;
    }
  }
  for (local_20 = 0; local_20 < this->_J; local_20 = local_20 + 1) {
    local_24 = 0;
    while( true ) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_Tj,(long)(int)local_20);
      if (*pvVar2 <= local_24) break;
      pvVar4 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_njt,(long)(int)local_20);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar4,(long)(int)local_24);
      uVar1 = *pvVar2;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_sumOfNjkSampled,(long)(int)local_20);
      pvVar4 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_kjt,(long)(int)local_20);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar4,(long)(int)local_24);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)*pvVar2);
      *pvVar3 = (double)uVar1 + *pvVar3;
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::storeSamples(){//{{{
    _samplingCount++;
    for(int k=0; k<_K; k++){
        _sumOfNkSampled[k] += _nk[k];
    }
    //nkv
    for(int k=0; k<_K; k++){
        for(int v=0; v<_V; v++){
            _sumOfNkvSampled[k][v] += _nkv[k][v];
        }
    }
    //njk
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _sumOfNjkSampled[j][_kjt[j][t]] += _njt[j][t];
        }
    }
}